

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

Psbt * __thiscall cfd::Psbt::operator=(Psbt *this,Psbt *psbt)

{
  CfdException *this_00;
  void *wally_psbt_pointer;
  int ret;
  wally_psbt *psbt_pointer;
  int local_6c;
  wally_psbt *local_68;
  Transaction local_60;
  
  if (this != psbt) {
    local_68 = (wally_psbt *)0x0;
    wally_psbt_pointer = (void *)0x0;
    local_6c = wally_psbt_clone_alloc
                         ((wally_psbt *)(psbt->super_Psbt).wally_psbt_pointer_,0,&local_68);
    if (local_6c != 0) {
      local_60.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x62a19e;
      local_60.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xd9;
      local_60.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x624594;
      core::logger::log<int&>
                ((CfdSourceLocation *)&local_60,kCfdLogLevelWarning,"wally_psbt_clone_alloc NG[{}]",
                 &local_6c);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_60.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&local_60.vin_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"psbt clone error.","");
      core::CfdException::CfdException(this_00,kCfdInternalError,(string *)&local_60);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Psbt::FreeWallyPsbtAddress
              ((Psbt *)(this->super_Psbt).wally_psbt_pointer_,wally_psbt_pointer);
    (this->super_Psbt).wally_psbt_pointer_ = local_68;
    core::Psbt::RebuildTransaction(&local_60,local_68);
    core::Transaction::operator=(&(this->super_Psbt).base_tx_,&local_60);
    core::Transaction::~Transaction(&local_60);
    std::
    _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
    ::operator=(&(this->verify_ignore_map_)._M_t,&(psbt->verify_ignore_map_)._M_t);
  }
  return this;
}

Assistant:

Psbt& Psbt::operator=(const Psbt& psbt) & {
  if (this != &psbt) {
    struct wally_psbt* psbt_pointer = nullptr;
    struct wally_psbt* psbt_src_pointer = nullptr;
    psbt_src_pointer =
        static_cast<struct wally_psbt*>(psbt.wally_psbt_pointer_);
    int ret = wally_psbt_clone_alloc(psbt_src_pointer, 0, &psbt_pointer);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_clone_alloc NG[{}]", ret);
      throw CfdException(CfdError::kCfdInternalError, "psbt clone error.");
    }
    cfd::core::Psbt::FreeWallyPsbtAddress(wally_psbt_pointer_);  // free
    wally_psbt_pointer_ = psbt_pointer;
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    verify_ignore_map_ = psbt.verify_ignore_map_;
  }
  return *this;
}